

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables_map.cpp
# Opt level: O1

variable_value * __thiscall program_options::variables_map::get(variables_map *this,string *name)

{
  const_iterator cVar1;
  variable_value *pvVar2;
  
  if (get(std::__cxx11::string_const&)::empty == '\0') {
    get();
  }
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
          ::find(&(this->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
                  )._M_t,name);
  pvVar2 = &get::empty;
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
       )._M_t._M_impl.super__Rb_tree_header) {
    pvVar2 = (variable_value *)(cVar1._M_node + 2);
  }
  return pvVar2;
}

Assistant:

const variable_value& variables_map::get(const std::string& name) const
{
    static variable_value empty;
    const_iterator i = this->find(name);
    if (i == this->end())
        return empty;
    else
        return i->second;
}